

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoverSymbols.cpp
# Opt level: O3

void __thiscall
slang::ast::CovergroupType::inheritMembers
          (CovergroupType *this,function_ref<void_(const_slang::ast::Symbol_&)> insertCB)

{
  char *pcVar1;
  SyntaxNode *pSVar2;
  Scope *this_00;
  Compilation *this_01;
  hash<std::basic_string_view<char,_std::char_traits<char>_>,_void> *this_02;
  long lVar3;
  uint uVar4;
  char cVar5;
  char cVar6;
  char cVar7;
  byte bVar8;
  size_t sVar9;
  bool bVar10;
  uint uVar11;
  int iVar12;
  Symbol *pSVar13;
  Type *pTVar14;
  Type *pTVar15;
  Diagnostic *pDVar16;
  uint64_t uVar17;
  TransparentMemberSymbol *pTVar18;
  ulong uVar19;
  long lVar20;
  Symbol *member;
  SourceLocation SVar21;
  SyntaxNode **this_03;
  ulong uVar22;
  SourceLocation args;
  byte bVar23;
  undefined1 auVar24 [16];
  string_view name;
  SourceRange sourceRange;
  size_t local_a0;
  
  pSVar2 = (this->super_Type).super_Symbol.originatingSyntax;
  if (pSVar2[4].parent != (SyntaxNode *)0x0) {
    this_00 = (this->super_Type).super_Symbol.parentScope;
    this_01 = this_00->compilation;
    this->baseGroup = this_01->errorType;
    pSVar13 = this_00->thisSym;
    if (pSVar13[1].indexInScope != 0) {
      Scope::elaborate((Scope *)&pSVar13[1].name);
    }
    SVar21 = pSVar13[2].location;
    if ((SVar21 != (SourceLocation)0x0) && (*(int *)SVar21 == 0x16)) {
      this_03 = &pSVar2[4].previewNode;
      name = parsing::Token::valueText((Token *)this_03);
      pSVar13 = Scope::find((Scope *)((long)SVar21 + 0x48),name);
      if ((pSVar13 != (Symbol *)0x0) &&
         ((pSVar13->kind == ClassProperty &&
          (pTVar14 = DeclaredType::getType((DeclaredType *)(pSVar13 + 1)),
          (pTVar14->super_Symbol).kind == CovergroupType)))) {
        this->baseGroup = pTVar14;
      }
      pTVar14 = this->baseGroup;
      pTVar15 = pTVar14->canonical;
      if (pTVar15 == (Type *)0x0) {
        Type::resolveCanonical(pTVar14);
        pTVar15 = pTVar14->canonical;
      }
      if ((pTVar15->super_Symbol).kind == ErrorType) {
        local_a0 = name._M_len;
        if (local_a0 != 0) {
          sourceRange = parsing::Token::range((Token *)this_03);
          pDVar16 = Scope::addDiag(this_00,(DiagCode)0xcd0006,sourceRange);
          pDVar16 = Diagnostic::operator<<(pDVar16,name);
          Diagnostic::operator<<(pDVar16,*(string_view *)((long)SVar21 + 8));
          return;
        }
      }
      else {
        pTVar14 = this->baseGroup;
        if (*(int *)&pTVar14[1].super_Symbol.nextInScope != 0) {
          Scope::elaborate((Scope *)(pTVar14 + 1));
        }
        sVar9 = *(size_t *)&pTVar14[2].super_Symbol;
        (this->arguments)._M_ptr = (pointer)pTVar14[1].canonical;
        (this->arguments)._M_extent._M_extent_value = sVar9;
        pcVar1 = pTVar14[2].super_Symbol.name._M_str;
        (this->event).super__Optional_base<const_slang::ast::TimingControl_*,_true,_true>._M_payload
        .super__Optional_payload_base<const_slang::ast::TimingControl_*>._M_payload =
             (_Storage<const_slang::ast::TimingControl_*,_true>)pTVar14[2].super_Symbol.name._M_len;
        *(char **)&(this->event).super__Optional_base<const_slang::ast::TimingControl_*,_true,_true>
                   ._M_payload.super__Optional_payload_base<const_slang::ast::TimingControl_*>.
                   _M_engaged = pcVar1;
        this_02 = (hash<std::basic_string_view<char,_std::char_traits<char>_>,_void> *)
                  (this->body->super_Scope).nameMap;
        if (*(int *)&pTVar14[1].super_Symbol.nextInScope != 0) {
          Scope::elaborate((Scope *)(pTVar14 + 1));
        }
        pSVar2 = pTVar14[1].super_Symbol.originatingSyntax;
        if (*(int *)&pSVar2[4].parent != 0) {
          Scope::elaborate((Scope *)&pSVar2[2].previewNode);
        }
        for (pSVar2 = pSVar2[3].previewNode; pSVar2 != (SyntaxNode *)0x0;
            pSVar2 = pSVar2[1].previewNode) {
          if (pSVar2->parent != (SyntaxNode *)0x0) {
            uVar17 = hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>::operator()
                               (this_02,(basic_string_view<char,_std::char_traits<char>_> *)
                                        &pSVar2->parent);
            uVar19 = uVar17 >> ((byte)*this_02 & 0x3f);
            lVar20 = (uVar17 & 0xff) * 4;
            cVar5 = (&UNK_004a938c)[lVar20];
            cVar6 = (&UNK_004a938d)[lVar20];
            cVar7 = (&UNK_004a938e)[lVar20];
            bVar8 = (&UNK_004a938f)[lVar20];
            uVar22 = 0;
            do {
              lVar20 = *(long *)(this_02 + 0x10);
              pcVar1 = (char *)(lVar20 + uVar19 * 0x10);
              bVar23 = pcVar1[0xf];
              auVar24[0] = -(*pcVar1 == cVar5);
              auVar24[1] = -(pcVar1[1] == cVar6);
              auVar24[2] = -(pcVar1[2] == cVar7);
              auVar24[3] = -(pcVar1[3] == bVar8);
              auVar24[4] = -(pcVar1[4] == cVar5);
              auVar24[5] = -(pcVar1[5] == cVar6);
              auVar24[6] = -(pcVar1[6] == cVar7);
              auVar24[7] = -(pcVar1[7] == bVar8);
              auVar24[8] = -(pcVar1[8] == cVar5);
              auVar24[9] = -(pcVar1[9] == cVar6);
              auVar24[10] = -(pcVar1[10] == cVar7);
              auVar24[0xb] = -(pcVar1[0xb] == bVar8);
              auVar24[0xc] = -(pcVar1[0xc] == cVar5);
              auVar24[0xd] = -(pcVar1[0xd] == cVar6);
              auVar24[0xe] = -(pcVar1[0xe] == cVar7);
              auVar24[0xf] = -(bVar23 == bVar8);
              uVar11 = (uint)(ushort)((ushort)(SUB161(auVar24 >> 7,0) & 1) |
                                      (ushort)(SUB161(auVar24 >> 0xf,0) & 1) << 1 |
                                      (ushort)(SUB161(auVar24 >> 0x17,0) & 1) << 2 |
                                      (ushort)(SUB161(auVar24 >> 0x1f,0) & 1) << 3 |
                                      (ushort)(SUB161(auVar24 >> 0x27,0) & 1) << 4 |
                                      (ushort)(SUB161(auVar24 >> 0x2f,0) & 1) << 5 |
                                      (ushort)(SUB161(auVar24 >> 0x37,0) & 1) << 6 |
                                      (ushort)(SUB161(auVar24 >> 0x3f,0) & 1) << 7 |
                                      (ushort)(SUB161(auVar24 >> 0x47,0) & 1) << 8 |
                                      (ushort)(SUB161(auVar24 >> 0x4f,0) & 1) << 9 |
                                      (ushort)(SUB161(auVar24 >> 0x57,0) & 1) << 10 |
                                      (ushort)(SUB161(auVar24 >> 0x5f,0) & 1) << 0xb |
                                      (ushort)(SUB161(auVar24 >> 0x67,0) & 1) << 0xc |
                                      (ushort)(SUB161(auVar24 >> 0x6f,0) & 1) << 0xd |
                                     (ushort)(SUB161(auVar24 >> 0x77,0) & 1) << 0xe);
              if (uVar11 != 0) {
                lVar3 = *(long *)(this_02 + 0x18);
                do {
                  uVar4 = 0;
                  if (uVar11 != 0) {
                    for (; (uVar11 >> uVar4 & 1) == 0; uVar4 = uVar4 + 1) {
                    }
                  }
                  bVar10 = std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>::
                           operator()((equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>
                                       *)this_02,
                                      (basic_string_view<char,_std::char_traits<char>_> *)
                                      &pSVar2->parent,
                                      (basic_string_view<char,_std::char_traits<char>_> *)
                                      ((ulong)uVar4 * 0x18 + lVar3 + uVar19 * 0x168));
                  if (bVar10) goto LAB_0023558a;
                  uVar11 = uVar11 - 1 & uVar11;
                } while (uVar11 != 0);
                bVar23 = *(byte *)(lVar20 + uVar19 * 0x10 + 0xf);
              }
              if (((&boost::unordered::detail::foa::
                     group15<boost::unordered::detail::foa::plain_integral>::
                     is_not_overflowed(unsigned_long)::shift)[(uint)uVar17 & 7] & bVar23) == 0)
              break;
              lVar20 = uVar19 + uVar22;
              uVar22 = uVar22 + 1;
              uVar19 = lVar20 + 1U & *(ulong *)(this_02 + 8);
            } while (uVar22 <= *(ulong *)(this_02 + 8));
            inheritMembers();
          }
LAB_0023558a:
        }
        if (*(int *)&pTVar14[1].super_Symbol.nextInScope != 0) {
          Scope::elaborate((Scope *)(pTVar14 + 1));
        }
        for (SVar21 = pTVar14[1].super_Symbol.location; SVar21 != (SourceLocation)0x0;
            SVar21 = *(SourceLocation *)((long)SVar21 + 0x28)) {
          iVar12 = *(int *)SVar21;
          args = SVar21;
          if (iVar12 == 5) {
            args = *(SourceLocation *)((long)SVar21 + 0x40);
            iVar12 = *(int *)args;
          }
          if (iVar12 == 0x3d) {
            pTVar18 = BumpAllocator::
                      emplace<slang::ast::TransparentMemberSymbol,slang::ast::Symbol_const&>
                                (&this_01->super_BumpAllocator,(Symbol *)args);
            (*insertCB.callback)(insertCB.callable,&pTVar18->super_Symbol);
          }
        }
      }
    }
  }
  return;
}

Assistant:

void CovergroupType::inheritMembers(function_ref<void(const Symbol&)> insertCB) const {
    auto syntax = getSyntax();
    auto scope = getParentScope();
    SLANG_ASSERT(syntax && scope);

    // If this covergroup doesn't inherit from anything then there's nothing to do.
    auto& cds = syntax->as<CovergroupDeclarationSyntax>();
    if (!cds.extends)
        return;

    auto& comp = scope->getCompilation();
    baseGroup = &comp.getErrorType();

    // Find the base class's group from which we are inheriting.
    auto baseClass = scope->asSymbol().as<ClassType>().getBaseClass();
    if (!baseClass || baseClass->kind != SymbolKind::ClassType)
        return;

    auto baseName = cds.name.valueText();
    auto candidateBase = baseClass->as<ClassType>().find(baseName);
    if (candidateBase && candidateBase->kind == SymbolKind::ClassProperty) {
        auto& ct = candidateBase->as<ClassPropertySymbol>().getType();
        if (ct.kind == SymbolKind::CovergroupType)
            baseGroup = &ct;
    }

    if (baseGroup->isError()) {
        if (!baseName.empty()) {
            scope->addDiag(diag::UnknownCovergroupBase, cds.name.range())
                << baseName << baseClass->name;
        }
        return;
    }

    auto& baseCG = baseGroup->as<CovergroupType>();
    arguments = baseCG.getArguments();
    event = baseCG.event;

    // We have the base group -- inherit all of the members from it.
    auto& scopeNameMap = body.getUnelaboratedNameMap();
    for (auto& member : baseCG.getBody().members()) {
        if (member.name.empty())
            continue;

        // Don't inherit if the member is already overridden.
        if (auto it = scopeNameMap.find(member.name); it != scopeNameMap.end())
            continue;

        // If the symbol itself was already inherited, create a new wrapper around
        // it for our own scope.
        const Symbol* toWrap = &member;
        if (member.kind == SymbolKind::TransparentMember)
            toWrap = &member.as<TransparentMemberSymbol>().wrapped;

        // All symbols get inserted into the beginning of the scope using the
        // provided insertion callback. We insert them as TransparentMemberSymbols
        // so that we can trace a path back to the actual location they are declared.
        auto wrapper = comp.emplace<TransparentMemberSymbol>(*toWrap);
        body.insertMember(wrapper, body.lastBuiltinMember, true, false);
    }

    // Also inherit any argument symbols are in the base covergroup type itself,
    // as opposed to the body which we already looked at above.
    for (auto& member : baseCG.members()) {
        const Symbol* toWrap = &member;
        if (member.kind == SymbolKind::TransparentMember)
            toWrap = &member.as<TransparentMemberSymbol>().wrapped;

        if (toWrap->kind == SymbolKind::FormalArgument) {
            auto wrapper = comp.emplace<TransparentMemberSymbol>(*toWrap);
            insertCB(*wrapper);
        }
    }
}